

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_sock_remove_dialer(nni_dialer *d)

{
  nni_sock *pnVar1;
  int iVar2;
  nni_sock *s;
  nni_dialer *d_local;
  
  pnVar1 = d->d_sock;
  nni_mtx_lock(&pnVar1->s_mx);
  iVar2 = nni_list_node_active(&d->d_node);
  if (iVar2 == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
              0x3ac,"nni_list_node_active(&d->d_node)");
  }
  nni_list_node_remove(&d->d_node);
  nni_mtx_unlock(&pnVar1->s_mx);
  nni_dialer_rele(d);
  return;
}

Assistant:

void
nni_sock_remove_dialer(nni_dialer *d)
{
	nni_sock *s = d->d_sock;
	nni_mtx_lock(&s->s_mx);
	NNI_ASSERT(nni_list_node_active(&d->d_node));
	nni_list_node_remove(&d->d_node);
	nni_mtx_unlock(&s->s_mx);

	// also drop the hold from the socket
	nni_dialer_rele(d);
}